

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codebinNoK(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int flip,int line)

{
  int line_local;
  int flip_local;
  expdesc *e2_local;
  expdesc *e1_local;
  BinOpr opr_local;
  FuncState *fs_local;
  
  if (flip != 0) {
    swapexps(e1,e2);
  }
  codebinexpval(fs,opr,e1,e2,line);
  return;
}

Assistant:

static void codebinNoK (FuncState *fs, BinOpr opr,
                        expdesc *e1, expdesc *e2, int flip, int line) {
  if (flip)
    swapexps(e1, e2);  /* back to original order */
  codebinexpval(fs, opr, e1, e2, line);  /* use standard operators */
}